

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsPosixFileReader.cpp
# Opt level: O1

void __thiscall xs::posix::FileReader::run(FileReader *this)

{
  deFileResult dVar1;
  void *__s;
  deInt64 *__n;
  value_type_conflict1 *__val;
  deInt64 numRead;
  deInt64 local_28;
  
  __s = operator_new(0x400);
  memset(__s,0,0x400);
  local_28 = 0;
  if ((this->m_buf).m_canceled == 0) {
    do {
      __n = &local_28;
      dVar1 = deFile_read(this->m_file,__s,0x400,&local_28);
      if (dVar1 == DE_FILERESULT_SUCCESS) {
        de::BlockBuffer<unsigned_char>::write(&this->m_buf,(int)local_28,__s,(size_t)__n);
        de::BlockBuffer<unsigned_char>::flush(&this->m_buf);
      }
      else {
        if (DE_FILERESULT_WOULD_BLOCK < dVar1) break;
        deSleep(100);
      }
    } while ((this->m_buf).m_canceled == 0);
  }
  operator_delete(__s,0x400);
  return;
}

Assistant:

void FileReader::run (void)
{
	std::vector<deUint8>	tmpBuf		(FILEREADER_TMP_BUFFER_SIZE);
	deInt64					numRead		= 0;

	while (!m_buf.isCanceled())
	{
		deFileResult result = deFile_read(m_file, &tmpBuf[0], (deInt64)tmpBuf.size(), &numRead);

		if (result == DE_FILERESULT_SUCCESS)
		{
			// Write to buffer.
			try
			{
				m_buf.write((int)numRead, &tmpBuf[0]);
				m_buf.flush();
			}
			catch (const ThreadedByteBuffer::CanceledException&)
			{
				// Canceled.
				break;
			}
		}
		else if (result == DE_FILERESULT_END_OF_FILE ||
				 result == DE_FILERESULT_WOULD_BLOCK)
		{
			// Wait for more data.
			deSleep(FILEREADER_IDLE_SLEEP);
		}
		else
			break; // Error.
	}
}